

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tagger.cpp
# Opt level: O2

char * __thiscall MeCab::anon_unknown_0::LatticeImpl::toString(LatticeImpl *this,Node *node)

{
  StringBuffer *os;
  char *pcVar1;
  
  os = stream(this);
  pcVar1 = toStringInternal(this,node,os);
  return pcVar1;
}

Assistant:

const char *LatticeImpl::toString(const Node *node) {
  return toStringInternal(node, stream());
}